

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlNodePtr *flags;
  byte *pbVar1;
  _xmlSchemaAnnot *p_Var2;
  _xmlAttr *p_Var3;
  xmlDictPtr pxVar4;
  xmlNodePtr ownerElem;
  bool bVar5;
  undefined1 auVar6 [8];
  _xmlSchemaType *refNs_00;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  _xmlSchemaType *p_Var11;
  xmlNodePtr pxVar12;
  xmlSchemaTypePtr pxVar13;
  xmlSchemaParticlePtr item;
  xmlAttrPtr attr;
  xmlSchemaQNameRefPtr pxVar14;
  xmlSchemaParticlePtr __s;
  xmlSchemaTreeItemPtr_conflict *ppxVar15;
  xmlAttrPtr pxVar16;
  xmlChar *pxVar17;
  xmlNodePtr pxVar18;
  xmlNodePtr pxVar19;
  xmlNs *pxVar20;
  xmlSchemaParticlePtr pxVar21;
  xmlSchemaAnnotPtr pxVar22;
  _xmlNode *p_Var23;
  _xmlNode *p_Var24;
  int *piVar25;
  _xmlSchemaType *attr_00;
  xmlNodePtr pxVar26;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar27;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlChar *name_01;
  xmlChar *name_02;
  _xmlSchemaAnnot *p_Var28;
  char *str2;
  undefined4 in_register_00000084;
  char *child;
  xmlSchemaTreeItemPtr_conflict *in_R9;
  xmlChar **uri;
  char *uri_00;
  xmlSchemaPtr schema_00;
  xmlSchemaParticlePtr pxVar29;
  xmlChar *name;
  xmlChar *refNs;
  xmlChar **in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  xmlSchemaParserCtxtPtr in_stack_ffffffffffffff78;
  xmlSchemaParticlePtr pxVar30;
  xmlChar *in_stack_ffffffffffffff80;
  undefined4 uVar32;
  undefined8 uVar31;
  xmlSchemaAnnotPtr local_58;
  undefined1 local_40 [8];
  _xmlSchemaType *local_38;
  
  child = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  piVar25 = isElemRef;
  p_Var11 = (_xmlSchemaType *)xmlSchemaGetPropNode(node,"name");
  pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  if (p_Var11 == (_xmlSchemaType *)0x0 && (pxVar12 == (xmlNodePtr)0x0 || topLevel != 0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1f906b,
               (xmlNodePtr)
               CONCAT71((int7)((ulong)piVar25 >> 8),pxVar12 == (xmlNodePtr)0x0 || topLevel != 0),
               child,(char *)in_R9);
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  xmlSchemaPValAttrID(ctxt,node,name_00);
  schema_00 = (xmlSchemaPtr)node->children;
  if (schema_00 == (xmlSchemaPtr)0x0) {
    schema_00 = (xmlSchemaPtr)0x0;
LAB_001ba25b:
    local_58 = (xmlSchemaAnnotPtr)0x0;
  }
  else {
    if ((((xmlNs *)schema_00->attrgrpDecl == (xmlNs *)0x0) ||
        (iVar7 = xmlStrEqual(schema_00->version,"annotation"), iVar7 == 0)) ||
       (iVar7 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
    goto LAB_001ba25b;
    local_58 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)schema_00,1);
    schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
  }
  if (topLevel == 0) {
    uVar8 = xmlGetMinOccurs(ctxt,node,-1,0x203502,(int)child,(char *)in_R9);
    uVar32 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    child = "(xs:nonNegativeInteger | unbounded)";
    iVar7 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x203518,(char *)in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar8,iVar7,(int)child);
    in_stack_ffffffffffffff80 = (xmlChar *)CONCAT44(uVar32,uVar8);
    item = xmlSchemaAddParticle(ctxt,node,uVar8,iVar7);
    if (item == (xmlSchemaParticlePtr)0x0) {
      if (local_58 == (xmlSchemaAnnotPtr)0x0) {
        return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
      }
      goto LAB_001ba515;
    }
    in_stack_ffffffffffffff78 = ctxt;
    if (pxVar12 == (xmlNodePtr)0x0) goto LAB_001ba26e;
    local_38 = (_xmlSchemaType *)0x0;
    local_40 = (undefined1  [8])0x0;
    if (isElemRef != (int *)0x0) {
      *isElemRef = 1;
    }
    attr = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar12);
    pxVar16 = (xmlAttrPtr)&stack0xffffffffffffffc8;
    uri = (xmlChar **)local_40;
    xmlSchemaPValAttrNodeQNameValue
              (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar12,attr,(xmlChar *)pxVar16,uri,
               in_stack_ffffffffffffff68);
    refNs_00 = local_38;
    attr_00 = local_38;
    xmlSchemaCheckReference(ctxt,(xmlSchemaPtr)node,pxVar12,(xmlAttrPtr)local_38,(xmlChar *)pxVar16)
    ;
    if (p_Var11 != (_xmlSchemaType *)0x0) {
      pxVar16 = (xmlAttrPtr)0x1fc6ab;
      uri = (xmlChar **)0x1f906b;
      xmlSchemaPMutualExclAttrErr
                (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)p_Var11,
                 "ref","name");
      attr_00 = p_Var11;
    }
    iVar9 = (int)in_stack_ffffffffffffff80;
    for (p_Var3 = node->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
      if (p_Var3->ns == (xmlNs *)0x0) {
        iVar9 = xmlStrEqual(p_Var3->name,"ref");
        if (((iVar9 == 0) && (iVar9 = xmlStrEqual(p_Var3->name,"name"), iVar9 == 0)) &&
           ((iVar9 = xmlStrEqual(p_Var3->name,"id"), iVar9 == 0 &&
            (iVar9 = xmlStrEqual(p_Var3->name,(xmlChar *)"maxOccurs"), iVar9 == 0)))) {
          iVar10 = xmlStrEqual(p_Var3->name,(xmlChar *)"minOccurs");
          iVar9 = (int)in_stack_ffffffffffffff80;
          if (iVar10 == 0) {
            xmlSchemaPCustomAttrErr
                      (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var3,
                       (xmlSchemaBasicItemPtr)
                       "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                       ,pxVar16,(char *)uri);
            break;
          }
        }
      }
      else {
        iVar9 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar9 != 0) {
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,ownerComp,(xmlAttrPtr)attr_00);
        }
      }
      iVar9 = (int)in_stack_ffffffffffffff80;
    }
    if (schema_00 != (xmlSchemaPtr)0x0) {
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                 (xmlNodePtr)schema_00,(xmlNodePtr)0x0,"(annotation?)",
                 (char *)in_stack_ffffffffffffff68);
    }
    if ((iVar7 != 0 || iVar9 != 0) &&
       (pxVar14 = xmlSchemaNewQNameRef
                            (ctxt,XML_SCHEMA_TYPE_ELEMENT,(xmlChar *)local_40,(xmlChar *)refNs_00),
       pxVar14 != (xmlSchemaQNameRefPtr)0x0)) {
      item->children = (xmlSchemaTreeItemPtr_conflict)pxVar14;
      item->annot = local_58;
      xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
      return (xmlSchemaBasicItemPtr)item;
    }
  }
  else {
    item = (xmlSchemaParticlePtr)0x0;
LAB_001ba26e:
    pxVar13 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar7 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)p_Var11,(xmlAttrPtr)pxVar13,
                       (xmlSchemaTypePtr)local_40,(xmlChar **)child);
    if (iVar7 == 0) {
      if (topLevel == 0) {
        pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
        if (pxVar12 == (xmlNodePtr)0x0) {
          if ((schema->flags & 1) != 0) goto LAB_001ba4ff;
          pxVar17 = (xmlChar *)0x0;
          uri_00 = (char *)in_R9;
        }
        else {
          uri_00 = (char *)xmlSchemaGetNodeContent(ctxt,pxVar12);
          iVar7 = xmlStrEqual((xmlChar *)uri_00,"qualified");
          if (iVar7 == 0) {
            iVar7 = xmlStrEqual((xmlChar *)uri_00,(xmlChar *)"unqualified");
            if (iVar7 == 0) {
              in_stack_ffffffffffffff68 = (xmlChar **)0x0;
              in_stack_ffffffffffffff70 = 0;
              child = "(qualified | unqualified)";
              pxVar17 = (xmlChar *)0x0;
              xmlSchemaPSimpleTypeErr
                        (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                         (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",uri_00,
                         (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff80);
            }
            else {
              pxVar17 = (xmlChar *)0x0;
              uri_00 = (char *)in_R9;
            }
          }
          else {
            pxVar17 = ctxt->targetNamespace;
            uri_00 = (char *)in_R9;
          }
        }
      }
      else {
LAB_001ba4ff:
        pxVar17 = ctxt->targetNamespace;
        uri_00 = (char *)in_R9;
      }
      auVar6 = local_40;
      if (local_40 != (undefined1  [8])0x0) {
        __s = (xmlSchemaParticlePtr)(*xmlMalloc)(200);
        if (__s != (xmlSchemaParticlePtr)0x0) {
          pxVar30 = __s;
          memset(__s,0,200);
          __s->type = XML_SCHEMA_TYPE_ELEMENT;
          __s->next = (xmlSchemaTreeItemPtr_conflict)auVar6;
          *(xmlChar **)(__s + 2) = pxVar17;
          __s[1].children = (xmlSchemaTreeItemPtr_conflict)node;
          pxVar16 = (xmlAttrPtr)ctxt->constructor->bucket;
          xmlSchemaAddItemSize
                    ((xmlSchemaItemListPtr *)(&pxVar16->doc + (topLevel == 0)),
                     (uint)(topLevel == 0) * 5 + 5,__s);
          xmlSchemaAddItemSize(&ctxt->constructor->pending,10,__s);
          iVar7 = (int)in_stack_ffffffffffffff70;
          for (p_Var3 = node->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
            if (p_Var3->ns == (xmlNs *)0x0) {
              iVar7 = xmlStrEqual(p_Var3->name,"name");
              if ((((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var3->name,"type"), iVar7 == 0)) &&
                  (iVar7 = xmlStrEqual(p_Var3->name,"id"), iVar7 == 0)) &&
                 (((iVar7 = xmlStrEqual(p_Var3->name,"default"), iVar7 == 0 &&
                   (iVar7 = xmlStrEqual(p_Var3->name,(xmlChar *)"fixed"), iVar7 == 0)) &&
                  ((iVar7 = xmlStrEqual(p_Var3->name,"block"), iVar7 == 0 &&
                   (iVar7 = xmlStrEqual(p_Var3->name,(xmlChar *)"nillable"), iVar7 == 0)))))) {
                if (topLevel == 0) {
                  iVar7 = xmlStrEqual(p_Var3->name,(xmlChar *)"maxOccurs");
                  if ((iVar7 == 0) &&
                     (iVar7 = xmlStrEqual(p_Var3->name,(xmlChar *)"minOccurs"), iVar7 == 0)) {
                    pxVar17 = p_Var3->name;
                    str2 = "form";
                    goto LAB_001ba7e7;
                  }
                }
                else {
                  iVar7 = xmlStrEqual(p_Var3->name,(xmlChar *)"final");
                  if ((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var3->name,"abstract"), iVar7 == 0)) {
                    pxVar17 = p_Var3->name;
                    str2 = "substitutionGroup";
LAB_001ba7e7:
                    iVar7 = xmlStrEqual(pxVar17,(xmlChar *)str2);
                    pxVar27 = extraout_RDX_00;
                    if (iVar7 == 0) goto LAB_001ba6d5;
                  }
                }
              }
            }
            else {
              iVar7 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar27 = extraout_RDX;
              if (iVar7 != 0) {
LAB_001ba6d5:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar27,pxVar16);
              }
            }
            iVar7 = (int)in_stack_ffffffffffffff70;
          }
          iVar9 = (int)pxVar16;
          pxVar29 = pxVar30;
          if (topLevel != 0) {
            *(byte *)&__s[1].node = *(byte *)&__s[1].node | 0x22;
            flags = &pxVar30[1].node;
            child = (char *)&pxVar30[2].minOccurs;
            uri_00 = (char *)&pxVar30[2].children;
            iVar9 = 0x203f5d;
            xmlSchemaPValAttrQName
                      (ctxt,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",child
                       ,(xmlChar **)uri_00,in_stack_ffffffffffffff68);
            iVar10 = xmlGetBooleanProp(ctxt,node,"abstract",iVar9);
            if (iVar10 != 0) {
              *(byte *)flags = *(byte *)flags | 0x10;
            }
            pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
            if (pxVar12 == (xmlNodePtr)0x0) {
              uVar8 = schema->flags;
              if ((uVar8 & 4) != 0) {
                pbVar1 = (byte *)((long)&pxVar30[1].node + 1);
                *pbVar1 = *pbVar1 | 0x80;
              }
              if ((uVar8 & 8) != 0) {
                pbVar1 = (byte *)((long)&pxVar30[1].node + 2);
                *pbVar1 = *pbVar1 | 1;
              }
            }
            else {
              ppxVar15 = (xmlSchemaTreeItemPtr_conflict *)xmlSchemaGetNodeContent(ctxt,pxVar12);
              in_stack_ffffffffffffff68 =
                   (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
              iVar9 = 0x10000;
              child = (char *)0xffffffff;
              uri_00 = (char *)0xffffffff;
              iVar10 = xmlSchemaPValAttrBlockFinal
                                 ((xmlChar *)ppxVar15,(int *)flags,0x8000,0x10000,-1,-1,-1,iVar7);
              if (iVar10 != 0) {
                in_stack_ffffffffffffff68 = (xmlChar **)0x0;
                iVar7 = 0;
                child = "(#all | List of (extension | restriction))";
                iVar9 = 0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                           (xmlNodePtr)0x0,
                           (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                           (char *)ppxVar15,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar29,
                           in_stack_ffffffffffffff80);
                uri_00 = (char *)ppxVar15;
              }
            }
          }
          pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
          if (pxVar12 == (xmlNodePtr)0x0) {
            uVar8 = schema->flags;
            if ((char)uVar8 < '\0') {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 0x10;
            }
            if ((uVar8 & 0x40) != 0) {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 8;
            }
            if ((uVar8 >> 8 & 1) != 0) {
              pbVar1 = (byte *)((long)&__s[1].node + 1);
              *pbVar1 = *pbVar1 | 0x20;
            }
          }
          else {
            ppxVar15 = (xmlSchemaTreeItemPtr_conflict *)xmlSchemaGetNodeContent(ctxt,pxVar12);
            in_stack_ffffffffffffff68 =
                 (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
            iVar9 = 0x1000;
            child = (char *)0x2000;
            uri_00 = (char *)0xffffffff;
            iVar7 = xmlSchemaPValAttrBlockFinal
                              ((xmlChar *)ppxVar15,(int *)&pxVar29[1].node,0x800,0x1000,0x2000,-1,-1
                               ,iVar7);
            if (iVar7 != 0) {
              in_stack_ffffffffffffff68 = (xmlChar **)0x0;
              child = "(#all | List of (extension | restriction | substitution))";
              iVar9 = 0;
              xmlSchemaPSimpleTypeErr
                        (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                         (xmlNodePtr)0x0,
                         (xmlSchemaTypePtr)
                         "(#all | List of (extension | restriction | substitution))",
                         (char *)ppxVar15,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar29,
                         in_stack_ffffffffffffff80);
              uri_00 = (char *)ppxVar15;
            }
          }
          iVar7 = xmlGetBooleanProp(ctxt,node,"nillable",iVar9);
          if (iVar7 != 0) {
            *(byte *)&__s[1].node = *(byte *)&__s[1].node | 1;
          }
          pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
          if (pxVar12 != (xmlNodePtr)0x0) {
            child = (char *)&pxVar29[2].next;
            uri_00 = (char *)&pxVar29[2].annot;
            pxVar16 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar12);
            xmlSchemaPValAttrNodeQNameValue
                      (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar12,pxVar16,(xmlChar *)child,
                       (xmlChar **)uri_00,in_stack_ffffffffffffff68);
            xmlSchemaCheckReference
                      (ctxt,(xmlSchemaPtr)node,pxVar12,(xmlAttrPtr)__s[2].next,(xmlChar *)child);
          }
          pxVar17 = xmlSchemaGetProp(ctxt,node,"default");
          *(xmlChar **)(__s + 3) = pxVar17;
          pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
          if (pxVar12 != (xmlNodePtr)0x0) {
            pxVar17 = xmlSchemaGetNodeContent(ctxt,pxVar12);
            if (*(long *)(__s + 3) == 0) {
              *(byte *)&__s[1].node = *(byte *)&__s[1].node | 8;
              *(xmlChar **)(__s + 3) = pxVar17;
            }
            else {
              child = "default";
              uri_00 = "fixed";
              xmlSchemaPMutualExclAttrErr
                        (ctxt,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                         (xmlAttrPtr)pxVar12,"default","fixed");
            }
          }
          if (schema_00 == (xmlSchemaPtr)0x0) goto LAB_001bb26b;
          if ((xmlNs *)schema_00->attrgrpDecl != (xmlNs *)0x0) {
            pxVar30 = pxVar29;
            iVar7 = xmlStrEqual(schema_00->version,(xmlChar *)"complexType");
            if ((iVar7 == 0) ||
               (iVar7 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
              if (((xmlNs *)schema_00->attrgrpDecl != (xmlNs *)0x0) &&
                 ((iVar7 = xmlStrEqual(schema_00->version,"simpleType"), iVar7 != 0 &&
                  (iVar7 = xmlStrEqual(((xmlNs *)schema_00->attrgrpDecl)->href,
                                       (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)))
                 ) {
                if (__s[2].annot == (xmlSchemaAnnotPtr)0x0) {
                  pxVar13 = xmlSchemaParseSimpleType(ctxt,schema,(xmlNodePtr)schema_00,0);
                  goto LAB_001bab87;
                }
                child = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                goto LAB_001bab49;
              }
            }
            else {
              if (__s[2].annot == (xmlSchemaAnnotPtr)0x0) {
                pxVar13 = xmlSchemaParseComplexType(ctxt,schema,(xmlNodePtr)schema_00,0);
LAB_001bab87:
                __s[1].annot = (xmlSchemaAnnotPtr)pxVar13;
                pxVar29 = pxVar30;
              }
              else {
                child = "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_001bab49:
                uri_00 = (char *)0x0;
                xmlSchemaPContentErr
                          (ctxt,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,
                           (xmlNodePtr)schema_00,(xmlNodePtr)child,(char *)0x0,
                           (char *)in_stack_ffffffffffffff68);
                pxVar29 = pxVar30;
              }
              schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
              if (schema_00 == (xmlSchemaPtr)0x0) goto LAB_001bb26b;
            }
          }
          pxVar29 = pxVar29 + 4;
          pxVar12 = (xmlNodePtr)0x0;
          pxVar30 = pxVar29;
          do {
            if ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0) ||
               (((iVar7 = xmlStrEqual(schema_00->version,(xmlChar *)"unique"), iVar7 == 0 ||
                 (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                && ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                    (((iVar7 = xmlStrEqual(schema_00->version,"key"), iVar7 == 0 ||
                      (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar7 == 0)) &&
                     ((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0 ||
                      ((iVar7 = xmlStrEqual(schema_00->version,"keyref"), iVar7 == 0 ||
                       (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar7 == 0)))))))))))) {
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                         (xmlNodePtr)schema_00,(xmlNodePtr)0x0,
                         "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                         (char *)in_stack_ffffffffffffff68);
              break;
            }
            pxVar26 = pxVar12;
            if (schema_00->attrgrpDecl == (xmlHashTablePtr)0x0) goto LAB_001baf89;
            pxVar18 = pxVar12;
            iVar7 = xmlStrEqual(schema_00->version,(xmlChar *)"unique");
            if ((iVar7 == 0) ||
               (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
              if (schema_00->attrgrpDecl == (xmlHashTablePtr)0x0) goto LAB_001baf89;
              pxVar18 = pxVar12;
              iVar7 = xmlStrEqual(schema_00->version,"key");
              if ((iVar7 != 0) &&
                 (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)) {
                uVar31 = 0x17;
                goto LAB_001bace6;
              }
              if (((schema_00->attrgrpDecl == (xmlHashTablePtr)0x0) ||
                  (iVar7 = xmlStrEqual(schema_00->version,"keyref"), iVar7 == 0)) ||
                 (iVar7 = xmlStrEqual((xmlChar *)schema_00->attrgrpDecl->dict,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
              goto LAB_001baf89;
              uVar31 = 0x18;
              bVar5 = true;
              pxVar18 = pxVar12;
            }
            else {
              uVar31 = 0x16;
LAB_001bace6:
              bVar5 = false;
            }
            uVar32 = (undefined4)uVar31;
            p_Var23 = *(_xmlNode **)(__s + 2);
            local_38 = (_xmlSchemaType *)0x0;
            pxVar29 = pxVar30;
            for (pxVar4 = (xmlDictPtr)schema_00->notaDecl; pxVar4 != (xmlDictPtr)0x0;
                pxVar4 = (xmlDictPtr)((xmlHashTablePtr)&pxVar4->seed)->table) {
              if (*(long *)&((xmlHashTablePtr)(pxVar4 + 1))->size == 0) {
                iVar7 = xmlStrEqual((xmlChar *)pxVar4->size,"id");
                if (((iVar7 == 0) &&
                    (iVar7 = xmlStrEqual((xmlChar *)pxVar4->size,"name"), iVar7 == 0)) &&
                   ((pxVar27 = extraout_RDX_02, !bVar5 ||
                    (iVar7 = xmlStrEqual((xmlChar *)pxVar4->size,"refer"), pxVar27 = extraout_RDX_03
                    , iVar7 == 0)))) goto LAB_001bad33;
              }
              else {
                iVar7 = xmlStrEqual(*(xmlChar **)
                                     (*(long *)&((xmlHashTablePtr)(pxVar4 + 1))->size + 0x10),
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar27 = extraout_RDX_01;
                if (iVar7 != 0) {
LAB_001bad33:
                  xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)pxVar4,pxVar27,(xmlAttrPtr)pxVar18)
                  ;
                }
              }
              uVar32 = (undefined4)uVar31;
            }
            pxVar16 = xmlSchemaGetPropNode((xmlNodePtr)schema_00,"name");
            if (pxVar16 == (xmlAttrPtr)0x0) {
              xmlSchemaPMissingAttrErr
                        (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1f906b,pxVar18,
                         child,uri_00);
LAB_001baf7d:
              pxVar26 = (xmlNodePtr)0x0;
              pxVar30 = pxVar29;
            }
            else {
              pxVar13 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
              iVar7 = xmlSchemaPValAttrNode
                                (ctxt,(xmlSchemaBasicItemPtr)pxVar16,(xmlAttrPtr)pxVar13,
                                 (xmlSchemaTypePtr)&stack0xffffffffffffffc8,(xmlChar **)child);
              p_Var11 = local_38;
              if ((iVar7 != 0) || (local_38 == (_xmlSchemaType *)0x0)) goto LAB_001baf7d;
              pxVar18 = (xmlNodePtr)(*xmlMalloc)(0x50);
              if (pxVar18 == (xmlNodePtr)0x0) {
                if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
                  ctxt->nberrors = ctxt->nberrors + 1;
                }
                child = "allocating an identity-constraint definition";
                pxVar30 = pxVar29;
                __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,
                                 "allocating an identity-constraint definition");
                pxVar26 = (xmlNodePtr)0x0;
                goto LAB_001baf89;
              }
              pxVar18->last = (_xmlNode *)0x0;
              pxVar18->parent = (_xmlNode *)0x0;
              pxVar18->_private = (void *)0x0;
              *(undefined8 *)&pxVar18->type = 0;
              pxVar18->name = (xmlChar *)0x0;
              pxVar18->children = (_xmlNode *)0x0;
              pxVar18->doc = (_xmlDoc *)0x0;
              pxVar18->ns = (xmlNs *)0x0;
              pxVar18->next = (_xmlNode *)0x0;
              pxVar18->prev = (_xmlNode *)0x0;
              pxVar18->parent = p_Var23;
              pxVar18->last = (_xmlNode *)p_Var11;
              *(undefined4 *)&pxVar18->_private = uVar32;
              pxVar18->children = (_xmlNode *)schema_00;
              xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,pxVar18);
              if (bVar5) {
                xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar18);
                xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,name_02);
                pxVar19 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)schema_00,"refer");
                pxVar30 = pxVar29;
                if (pxVar19 == (xmlNodePtr)0x0) {
                  xmlSchemaPMissingAttrErr
                            (ctxt,(xmlParserErrors)schema_00,(xmlSchemaBasicItemPtr)0x1efcf9,pxVar18
                             ,child,uri_00);
                }
                else {
                  pxVar20 = (xmlNs *)xmlSchemaNewQNameRef
                                               (ctxt,XML_SCHEMA_TYPE_IDC_KEY,(xmlChar *)0x0,
                                                (xmlChar *)0x0);
                  pxVar18->ns = pxVar20;
                  pxVar26 = (xmlNodePtr)0x0;
                  if (pxVar20 == (xmlNs *)0x0) goto LAB_001baf89;
                  child = (char *)&pxVar20->_private;
                  uri_00 = (char *)&pxVar20->prefix;
                  pxVar16 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,pxVar19);
                  xmlSchemaPValAttrNodeQNameValue
                            (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar19,pxVar16,(xmlChar *)child,
                             (xmlChar **)uri_00,in_stack_ffffffffffffff68);
                  xmlSchemaCheckReference
                            (ctxt,schema_00,pxVar19,(xmlAttrPtr)pxVar18->ns->_private,
                             (xmlChar *)child);
                }
              }
              else {
                xmlSchemaPValAttrID(ctxt,(xmlNodePtr)schema_00,name_01);
                pxVar30 = pxVar29;
              }
              pxVar19 = (xmlNodePtr)schema_00->id;
              pxVar26 = pxVar18;
              if (pxVar19 == (xmlNodePtr)0x0) {
LAB_001bb1b3:
                child = "A child element is missing";
                uri_00 = "(annotation?, (selector, field+))";
                xmlSchemaPContentErr
                          (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)schema_00,
                           (xmlNodePtr)0x0,(xmlNodePtr)"A child element is missing",
                           "(annotation?, (selector, field+))",(char *)in_stack_ffffffffffffff68);
              }
              else {
                if (((pxVar19->ns != (xmlNs *)0x0) &&
                    (iVar7 = xmlStrEqual(pxVar19->name,"annotation"), iVar7 != 0)) &&
                   (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0))
                {
                  pxVar22 = xmlSchemaParseAnnotation(ctxt,pxVar19,1);
                  *(xmlSchemaAnnotPtr *)&pxVar18->type = pxVar22;
                  pxVar19 = pxVar19->next;
                  if (pxVar19 == (_xmlNode *)0x0) goto LAB_001bb1b3;
                }
                pxVar29 = pxVar30;
                if (((pxVar19->ns != (xmlNs *)0x0) &&
                    (iVar7 = xmlStrEqual(pxVar19->name,(xmlChar *)"selector"), iVar7 != 0)) &&
                   (iVar7 = xmlStrEqual(pxVar19->ns->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0))
                {
                  p_Var23 = (_xmlNode *)
                            xmlSchemaParseIDCSelectorAndField
                                      (ctxt,(xmlSchemaIDCPtr_conflict)pxVar18,pxVar19,0);
                  pxVar18->next = p_Var23;
                  ownerElem = pxVar19->next;
                  if (ownerElem == (xmlNodePtr)0x0) {
                    child = (char *)0x0;
                    uri_00 = "(annotation?, (selector, field+))";
                    xmlSchemaPContentErr
                              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                               (xmlSchemaBasicItemPtr)schema_00,(xmlNodePtr)0x0,(xmlNodePtr)0x0,
                               "(annotation?, (selector, field+))",(char *)in_stack_ffffffffffffff68
                              );
                    pxVar30 = pxVar29;
                    goto LAB_001baf89;
                  }
                  pxVar19 = ownerElem;
                  if (((ownerElem->ns == (xmlNs *)0x0) ||
                      (iVar7 = xmlStrEqual(ownerElem->name,(xmlChar *)"field"), iVar7 == 0)) ||
                     (iVar7 = xmlStrEqual(ownerElem->ns->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0
                     )) {
                    xmlSchemaPContentErr
                              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                               (xmlSchemaBasicItemPtr)schema_00,ownerElem,(xmlNodePtr)0x0,
                               "(annotation?, (selector, field+))",(char *)in_stack_ffffffffffffff68
                              );
                  }
                  else {
                    p_Var23 = (_xmlNode *)0x0;
                    do {
                      p_Var24 = (_xmlNode *)
                                xmlSchemaParseIDCSelectorAndField
                                          (ctxt,(xmlSchemaIDCPtr_conflict)pxVar18,pxVar19,1);
                      if (p_Var24 != (_xmlNode *)0x0) {
                        iVar7 = *(int *)&pxVar18->doc;
                        *(int *)&p_Var24->name = iVar7;
                        *(int *)&pxVar18->doc = iVar7 + 1;
                        if (p_Var23 == (_xmlNode *)0x0) {
                          p_Var23 = (_xmlNode *)&pxVar18->prev;
                        }
                        p_Var23->_private = p_Var24;
                        p_Var23 = p_Var24;
                      }
                      p_Var24 = pxVar19->next;
                      pxVar30 = pxVar29;
                      if (p_Var24 == (_xmlNode *)0x0) goto LAB_001baf89;
                      pxVar19 = p_Var24;
                    } while (((p_Var24->ns != (xmlNs *)0x0) &&
                             (iVar7 = xmlStrEqual(p_Var24->name,(xmlChar *)"field"), iVar7 != 0)) &&
                            (iVar7 = xmlStrEqual(p_Var24->ns->href,
                                                 (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                            iVar7 != 0));
                  }
                }
                child = (char *)0x0;
                uri_00 = "(annotation?, (selector, field+))";
                xmlSchemaPContentErr
                          (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)schema_00,
                           pxVar19,(xmlNodePtr)0x0,"(annotation?, (selector, field+))",
                           (char *)in_stack_ffffffffffffff68);
                pxVar30 = pxVar29;
              }
            }
LAB_001baf89:
            pxVar21 = (xmlSchemaParticlePtr)&pxVar12->name;
            if (pxVar12 == (xmlNodePtr)0x0) {
              pxVar21 = pxVar29;
            }
            *(xmlNodePtr *)pxVar21 = pxVar26;
            schema_00 = *(xmlSchemaPtr *)&schema_00->flags;
            pxVar12 = pxVar26;
          } while (schema_00 != (xmlSchemaPtr)0x0);
LAB_001bb26b:
          *(xmlSchemaAnnotPtr *)(__s + 1) = local_58;
          if (topLevel != 0) {
            return (xmlSchemaBasicItemPtr)__s;
          }
          item->children = (xmlSchemaTreeItemPtr_conflict)__s;
          return (xmlSchemaBasicItemPtr)item;
        }
        if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
          ctxt->nberrors = ctxt->nberrors + 1;
        }
        __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating element");
      }
    }
  }
  if (local_58 == (xmlSchemaAnnotPtr)0x0) {
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  if (item != (xmlSchemaParticlePtr)0x0) {
    item->annot = (xmlSchemaAnnotPtr)0x0;
  }
LAB_001ba515:
  p_Var28 = local_58->next;
  (*xmlFree)(local_58);
  if (p_Var28 == (_xmlSchemaAnnot *)0x0) {
    return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
  }
  do {
    p_Var2 = p_Var28->next;
    (*xmlFree)(p_Var28);
    p_Var28 = p_Var2;
  } while (p_Var2 != (_xmlSchemaAnnot *)0x0);
  return (xmlSchemaBasicItemPtr)(xmlSchemaParticlePtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}